

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cpp
# Opt level: O2

bool ReadFD(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  RegularFormat reg_fmt;
  bool bVar1;
  int iVar2;
  int iVar3;
  string *path;
  Data *data;
  allocator<char> local_a9;
  pointer local_a8;
  size_type sStack_a0;
  size_type local_98;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  undefined8 uStack_76;
  bool bStack_6f;
  undefined1 local_68 [64];
  
  path = MemFile::name_abi_cxx11_(file);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"fd",&local_a9);
  bVar1 = IsFileExt(path,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  if (bVar1) {
    iVar2 = MemFile::size(file);
    if (iVar2 == 0x14000) {
      reg_fmt = TO_80K_FM;
    }
    else if (iVar2 == 0x28000) {
      if (opt.encoding == FM) {
        reg_fmt = TO_160K_FM;
      }
      else {
        reg_fmt = TO_160K_MFM;
      }
    }
    else if (iVar2 == 0x50000) {
      reg_fmt = TO_320K_MFM;
    }
    else {
      if (iVar2 != 0xa0000) goto LAB_00190967;
      reg_fmt = TO_640K_MFM;
    }
    Format::Format((Format *)local_68,reg_fmt);
    uStack_76 = local_68._50_8_;
    iStack_88 = local_68._32_4_;
    iStack_84 = local_68._36_4_;
    local_98 = local_68._16_8_;
    iStack_90 = local_68._24_4_;
    iStack_8c = local_68._28_4_;
    local_a8 = (pointer)local_68._0_8_;
    sStack_a0 = local_68._8_8_;
    iVar2 = Format::disk_size((Format *)&local_a8);
    iVar3 = MemFile::size(file);
    if (iVar2 != iVar3) {
      __assert_fail("fmt.disk_size() == file.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/fd.cpp"
                    ,0x2e,"bool ReadFD(MemFile &, std::shared_ptr<Disk> &)");
    }
    this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    data = MemFile::data(file);
    Disk::format(this,(Format *)&local_a8,data,bStack_6f);
    std::__cxx11::string::assign
              ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                        strType);
    bVar1 = true;
  }
  else {
LAB_00190967:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ReadFD(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt;

    if (!IsFileExt(file.name(), "fd"))
        return false;

    switch (file.size())
    {
    case 655360:
        fmt = RegularFormat::TO_640K_MFM;
        break;

    case 327680:
        fmt = RegularFormat::TO_320K_MFM;
        break;

    case 163840:
        if (opt.encoding == Encoding::FM)
            fmt = RegularFormat::TO_160K_FM;
        else
            fmt = RegularFormat::TO_160K_MFM;
        break;

    case 81920:
        fmt = RegularFormat::TO_80K_FM;
        break;

    default:
        return false;
    }

    assert(fmt.disk_size() == file.size());
    disk->format(fmt, file.data(), fmt.cyls_first);
    disk->strType = "FD";
    return true;
}